

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# treewalker.cpp
# Opt level: O2

void __thiscall TreeWalker::acceptActionGroup(TreeWalker *this,DomActionGroup *actionGroup)

{
  ulong uVar1;
  int i;
  ulong uVar2;
  long in_FS_OFFSET;
  QArrayDataPointer<DomActionGroup_*> local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  uVar2 = 0;
  while( true ) {
    local_48.d = (Data *)(actionGroup->m_action).d.d;
    local_48.ptr = (DomActionGroup **)(actionGroup->m_action).d.ptr;
    uVar1 = (actionGroup->m_action).d.size;
    if (local_48.d != (Data *)0x0) {
      LOCK();
      (((Data *)local_48.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (((Data *)local_48.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_48.size = uVar1;
    QArrayDataPointer<DomAction_*>::~QArrayDataPointer((QArrayDataPointer<DomAction_*> *)&local_48);
    if (uVar1 <= uVar2) break;
    local_48.d = (Data *)(actionGroup->m_action).d.d;
    local_48.ptr = (DomActionGroup **)(actionGroup->m_action).d.ptr;
    local_48.size = (actionGroup->m_action).d.size;
    if (local_48.d != (Data *)0x0) {
      LOCK();
      (((Data *)local_48.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (((Data *)local_48.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    (*this->_vptr_TreeWalker[0x1a])(this,local_48.ptr[uVar2]);
    QArrayDataPointer<DomAction_*>::~QArrayDataPointer((QArrayDataPointer<DomAction_*> *)&local_48);
    uVar2 = uVar2 + 1;
  }
  uVar2 = 0;
  while( true ) {
    local_48.d = (actionGroup->m_actionGroup).d.d;
    local_48.ptr = (actionGroup->m_actionGroup).d.ptr;
    uVar1 = (actionGroup->m_actionGroup).d.size;
    if (local_48.d != (Data *)0x0) {
      LOCK();
      ((local_48.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_48.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_48.size = uVar1;
    QArrayDataPointer<DomActionGroup_*>::~QArrayDataPointer(&local_48);
    if (uVar1 <= uVar2) break;
    local_48.d = (actionGroup->m_actionGroup).d.d;
    local_48.ptr = (actionGroup->m_actionGroup).d.ptr;
    local_48.size = (actionGroup->m_actionGroup).d.size;
    if (local_48.d != (Data *)0x0) {
      LOCK();
      ((local_48.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_48.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    (*this->_vptr_TreeWalker[0x1b])(this,local_48.ptr[uVar2]);
    QArrayDataPointer<DomActionGroup_*>::~QArrayDataPointer(&local_48);
    uVar2 = uVar2 + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void TreeWalker::acceptActionGroup(DomActionGroup *actionGroup)
{
    for (int i=0; i<actionGroup->elementAction().size(); ++i)
        acceptAction(actionGroup->elementAction().at(i));

    for (int i=0; i<actionGroup->elementActionGroup().size(); ++i)
        acceptActionGroup(actionGroup->elementActionGroup().at(i));
}